

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

Image * vera::toSdfLayer(Image *__return_storage_ptr__,BVH *_acc,size_t _voxel_resolution,
                        size_t _z_layer,float _refinement)

{
  pointer pTVar1;
  Material *this;
  BVH *pBVar2;
  size_type sVar3;
  bool bVar4;
  uint uVar5;
  undefined7 extraout_var;
  undefined8 extraout_RDX;
  int iVar6;
  thread *t_2;
  _Alloc_hider _Var7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  thread t;
  Image *layer;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  long *local_c8;
  undefined4 local_c0;
  float local_bc;
  thread local_b8;
  Image *local_b0;
  float local_a4;
  BVH *local_a0;
  string local_98;
  size_t local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  ulong local_40;
  ulong local_38;
  
  local_b0 = __return_storage_ptr__;
  local_a4 = _refinement;
  local_a0 = _acc;
  local_70 = _z_layer;
  uVar5 = std::thread::hardware_concurrency();
  pBVar2 = local_a0;
  uVar8 = (ulong)uVar5;
  if (_voxel_resolution < (ulong)(long)(int)uVar5) {
    uVar8 = _voxel_resolution & 0xffffffff;
  }
  iVar10 = (int)uVar8;
  local_40 = _voxel_resolution / (ulong)(long)iVar10;
  local_38 = _voxel_resolution % (ulong)(long)iVar10;
  local_68._0_4_ = *(float *)&(local_a0->super_BoundingBox).min.field_0;
  local_68._4_4_ = *(float *)&(local_a0->super_BoundingBox).min.field_1;
  uStack_60 = 0;
  local_58._0_4_ = *(float *)&(local_a0->super_BoundingBox).max.field_0;
  local_58._4_4_ = *(float *)&(local_a0->super_BoundingBox).max.field_1;
  uStack_50 = 0;
  local_bc = (local_a0->super_BoundingBox).max.field_2.z -
             (local_a0->super_BoundingBox).min.field_2.z;
  Image::Image(local_b0,(int)_voxel_resolution,(int)_voxel_resolution,4);
  pTVar1 = (pBVar2->elements).super__Vector_base<vera::Triangle,_std::allocator<vera::Triangle>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_c0 = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  if ((pTVar1->m_colors).
      super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      *(pointer *)
       ((long)&(pTVar1->m_colors).
               super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
               ._M_impl + 8)) {
    this = pTVar1->material;
    if (this == (Material *)0x0) {
      local_c0 = 0;
    }
    else {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"diffuse","");
      bVar4 = Material::haveProperty(this,&local_98);
      local_c0 = (undefined4)CONCAT71(extraout_var,bVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
    }
  }
  local_98._M_dataplus._M_p = (pointer)0x0;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  if (0 < iVar10) {
    local_58._0_4_ = (float)local_58 - (float)local_68;
    local_58._4_4_ = local_58._4_4_ - local_68._4_4_;
    uStack_50 = CONCAT44(uStack_50._4_4_ - uStack_60._4_4_,(float)uStack_50 - (float)uStack_60);
    local_68 = CONCAT44(local_68._4_4_,
                        SQRT(local_58._4_4_ * local_58._4_4_ + (float)local_58 * (float)local_58 +
                             local_bc * local_bc) * 0.5);
    iVar10 = 0;
    do {
      iVar9 = iVar10 * (int)local_40;
      iVar6 = 0;
      if ((int)uVar8 == 1) {
        iVar6 = (int)local_38;
      }
      iVar6 = iVar6 + (int)local_40 + iVar9;
      if ((char)local_c0 == '\0') {
        local_b8._M_id._M_thread = (id)0;
        local_c8 = (long *)operator_new(0x48);
        *local_c8 = (long)&PTR___State_003da450;
        local_c8[1] = (long)local_a0;
        local_c8[2] = (long)local_b0;
        *(int *)(local_c8 + 3) = iVar9;
        *(int *)((long)local_c8 + 0x1c) = iVar6;
        local_c8[4] = local_70;
        local_c8[5] = _voxel_resolution;
        *(float *)(local_c8 + 6) = 1.0 / (float)_voxel_resolution;
        *(undefined8 *)((long)local_c8 + 0x34) = local_58;
        *(float *)((long)local_c8 + 0x3c) = local_bc;
        *(float *)(local_c8 + 8) = (float)local_68;
        *(float *)((long)local_c8 + 0x44) = local_a4;
        std::thread::_M_start_thread(&local_b8,&local_c8,0);
        if (local_c8 != (long *)0x0) {
          (**(code **)(*local_c8 + 8))();
        }
        std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                  ((vector<std::thread,_std::allocator<std::thread>_> *)&local_98,&local_b8);
      }
      else {
        local_b8._M_id._M_thread = (id)0;
        local_c8 = (long *)operator_new(0x48);
        *local_c8 = (long)&PTR___State_003da410;
        local_c8[1] = (long)local_a0;
        local_c8[2] = (long)local_b0;
        *(int *)(local_c8 + 3) = iVar9;
        *(int *)((long)local_c8 + 0x1c) = iVar6;
        local_c8[4] = local_70;
        local_c8[5] = _voxel_resolution;
        *(float *)(local_c8 + 6) = 1.0 / (float)_voxel_resolution;
        *(undefined8 *)((long)local_c8 + 0x34) = local_58;
        *(float *)((long)local_c8 + 0x3c) = local_bc;
        *(float *)(local_c8 + 8) = (float)local_68;
        *(float *)((long)local_c8 + 0x44) = local_a4;
        std::thread::_M_start_thread(&local_b8,&local_c8,0);
        if (local_c8 != (long *)0x0) {
          (**(code **)(*local_c8 + 8))();
        }
        std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                  ((vector<std::thread,_std::allocator<std::thread>_> *)&local_98,&local_b8);
      }
      sVar3 = local_98._M_string_length;
      if (local_b8._M_id._M_thread != 0) {
        std::terminate();
      }
      iVar10 = iVar10 + 1;
      uVar5 = (int)uVar8 - 1;
      uVar8 = (ulong)uVar5;
      _Var7._M_p = local_98._M_dataplus._M_p;
    } while (uVar5 != 0);
    for (; _Var7._M_p != (pointer)sVar3; _Var7._M_p = _Var7._M_p + 8) {
      std::thread::join();
    }
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&local_98);
  return local_b0;
}

Assistant:

Image toSdfLayer( const BVH* _acc, size_t _voxel_resolution, size_t _z_layer, float _refinement) {
    float voxel_size    = 1.0/float(_voxel_resolution);
    int nThreads  = std::thread::hardware_concurrency();

    if (nThreads > _voxel_resolution)
        nThreads = _voxel_resolution;

    int layersPerThread = _voxel_resolution / nThreads;
    int layersLeftOver  = _voxel_resolution % nThreads;
    glm::vec3 bdiagonal = _acc->getDiagonal();
    float max_dist      = glm::length(bdiagonal) * 0.5f;

    Image layer = Image(_voxel_resolution, _voxel_resolution, 4);

    bool RGBD = _acc->elements[0].haveColors();
    if (!RGBD && _acc->elements[0].material != nullptr)
        if (_acc->elements[0].material->haveProperty("diffuse"))
            RGBD = true;
    // RGBD = false;

    std::vector<std::thread> threads;
    for (int i = 0; i < nThreads; ++i) {
        int start_row = i * layersPerThread;
        int end_row = start_row + layersPerThread;
        if (i == nThreads - 1)
            end_row = start_row + layersPerThread + layersLeftOver;


        if (RGBD) {
            std::thread t(
                [_acc, &layer, start_row, end_row, _z_layer, _voxel_resolution, voxel_size, bdiagonal, max_dist, _refinement]() {
                    for (int y = start_row; y < end_row; y++)
                    for (int x = 0; x < _voxel_resolution; x++) {
                        glm::vec3 p = (glm::vec3(x, y, _z_layer) + 0.5f) * voxel_size;
                        p = _acc->min + p * bdiagonal;

                        glm::vec4 c = _acc->getClosestRGBSignedDistance(p, max_dist * _refinement);

                        c.a = glm::clamp(c.a/max_dist, -1.0f, 1.0f) * 0.5 + 0.5;
                        size_t index = layer.getIndex(x, y);

                        layer.setColor(index, c);
                    }
                }
            );
            threads.push_back(std::move(t));
        }
        else {
            std::thread t(
                [_acc, &layer, start_row, end_row, _z_layer, _voxel_resolution, voxel_size, bdiagonal, max_dist, _refinement]() {
                    for (int y = start_row; y < end_row; y++)
                    for (int x = 0; x < _voxel_resolution; x++) {

                        glm::vec3 p = (glm::vec3(x, y, _z_layer) + 0.5f) * voxel_size;
                        p = _acc->min + p * bdiagonal;

                        glm::vec4 c = glm::vec4( 1.0f, 1.0f, 1.0f, _acc->getClosestSignedDistance(p, max_dist * _refinement) );

                        c.a = glm::clamp(c.a/max_dist, -1.0f, 1.0f) * 0.5 + 0.5;
                        size_t index = layer.getIndex(x, y);

                        layer.setColor(index, c);
                    }
                }
            );
            threads.push_back(std::move(t));
        }
    }

    for (std::thread& t : threads)
        t.join();

    return layer;
}